

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialog::selectMimeTypeFilter(QFileDialog *this,QString *filter)

{
  QDialogPrivate *this_00;
  undefined1 *puVar1;
  QPlatformDialogHelper *pQVar2;
  long in_FS_OFFSET;
  QArrayData *local_58;
  undefined8 uStack_50;
  long local_48;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QFileDialogOptions::setInitiallySelectedMimeTypeFilter
            ((QString *)this_00[1].super_QWidgetPrivate.toolTip.d.ptr);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  nameFilterForMime(&local_38,filter);
  if ((this_00->nativeDialogInUse != false) ||
     (puVar1 = (undefined1 *)local_38.d.size,
     this_00[1].super_QWidgetPrivate.focus_child == (QWidget *)0x0)) {
    pQVar2 = QDialogPrivate::platformHelper(this_00);
    if (pQVar2 != (QPlatformDialogHelper *)0x0) {
      (**(code **)(*(long *)pQVar2 + 0xb0))(pQVar2,filter);
    }
    pQVar2 = QDialogPrivate::platformHelper(this_00);
    if (pQVar2 == (QPlatformDialogHelper *)0x0) {
      local_58 = (QArrayData *)0x0;
      uStack_50 = 0;
      local_48 = 0;
    }
    else {
      (**(code **)(*(long *)pQVar2 + 0xc0))(&local_58,pQVar2);
    }
    puVar1 = (undefined1 *)local_38.d.size;
    if (local_48 != 0) {
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,2,0x10);
        }
      }
      goto LAB_004ed23e;
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
  }
  if (puVar1 != (undefined1 *)0x0) {
    selectNameFilter(this,&local_38);
  }
LAB_004ed23e:
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialog::selectMimeTypeFilter(const QString &filter)
{
    Q_D(QFileDialog);
    d->options->setInitiallySelectedMimeTypeFilter(filter);

    const QString filterForMime = nameFilterForMime(filter);

    if (!d->usingWidgets()) {
        d->selectMimeTypeFilter_sys(filter);
        if (d->selectedMimeTypeFilter_sys().isEmpty() && !filterForMime.isEmpty()) {
            selectNameFilter(filterForMime);
        }
    } else if (!filterForMime.isEmpty()) {
        selectNameFilter(filterForMime);
    }
}